

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

ostream * argparse::operator<<(ostream *stream,Argument *argument)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  Argument *pAVar1;
  bool bVar2;
  const_reference this;
  NArgsRange *pNVar3;
  size_type sVar4;
  ostream *poVar6;
  string *in_R8;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  bool local_451;
  bool local_3c1;
  NArgsRange local_398;
  size_t local_388;
  size_t sStack_380;
  undefined1 auStack_378 [8];
  basic_string_view<char,_std::char_traits<char>_> leftover;
  basic_string_view<char,_std::char_traits<char>_> line;
  string_view help_view;
  char *hspace;
  size_type sStack_2f8;
  bool first_line;
  size_type prev;
  size_type pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0 [8];
  string name_padding;
  streamsize stream_width;
  allocator<char> local_281;
  string local_280 [32];
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  string local_250;
  allocator<char> local_229;
  string local_228 [32];
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  string local_1f8;
  size_t local_1d8;
  char *pcStack_1d0;
  __sv_type local_1c0;
  stringstream local_1a0 [8];
  stringstream name_stream;
  ostream local_190 [376];
  Argument *local_18;
  Argument *argument_local;
  ostream *stream_local;
  char *pcVar5;
  
  local_18 = argument;
  argument_local = (Argument *)stream;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"  ");
  this = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::front(&local_18->m_names);
  local_1c0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
  local_1d8 = (local_18->m_prefix_chars)._M_len;
  pcStack_1d0 = (local_18->m_prefix_chars)._M_str;
  bVar2 = Argument::is_positional(local_1c0,local_18->m_prefix_chars);
  if (bVar2) {
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&local_18->m_metavar);
    if (bVar2) {
      local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin(&local_18->m_names);
      local_208._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&local_18->m_names);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_228," ",&local_229);
      details::
      join<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (&local_1f8,(details *)local_200,local_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                 in_R8);
      std::operator<<(local_190,(string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator(&local_229);
    }
    else {
      std::operator<<(local_190,(string *)&local_18->m_metavar);
    }
  }
  else {
    local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(&local_18->m_names);
    local_260._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&local_18->m_names);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_280,", ",&local_281);
    details::
    join<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&local_250,(details *)local_258,local_260,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,in_R8)
    ;
    std::operator<<(local_190,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator(&local_281);
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&local_18->m_metavar);
    local_3c1 = false;
    if (!bVar2) {
      pNVar3 = &local_18->m_num_args_range;
      Argument::NArgsRange::NArgsRange((NArgsRange *)&stream_width,1,1);
      local_3c1 = Argument::NArgsRange::operator==(pNVar3,(NArgsRange *)&stream_width);
    }
    if (local_3c1 != false) {
      poVar6 = std::operator<<(local_190," ");
      std::operator<<(poVar6,(string *)&local_18->m_metavar);
    }
  }
  name_padding.field_2._8_8_ =
       std::ios_base::width
                 ((ios_base *)
                  ((long)&(argument_local->m_names).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                  (argument_local->m_names).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length));
  std::__cxx11::stringstream::str();
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&local_2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2c0,sVar4,' ',(allocator<char> *)((long)&pos + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
  std::__cxx11::string::~string((string *)&local_2e0);
  pAVar1 = argument_local;
  sStack_2f8 = 0;
  bVar2 = true;
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)pAVar1,(string *)&help_view._M_str);
  std::__cxx11::string::~string((string *)&help_view._M_str);
  join_0x00000010_0x00000000_ =
       std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_18->m_help);
  while (sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(&local_18->m_help,'\n',sStack_2f8), sVar4 != 0xffffffffffffffff) {
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&line._M_str,sStack_2f8,
                       (sVar4 - sStack_2f8) + 1);
    line._M_len = (size_t)bVar7._M_str;
    pcVar5 = (char *)bVar7._M_len;
    if (bVar2) {
      poVar6 = std::operator<<((ostream *)argument_local,"  ");
      __str_00._M_str = (char *)line._M_len;
      __str_00._M_len = (size_t)pcVar5;
      std::operator<<(poVar6,__str_00);
      bVar2 = false;
    }
    else {
      std::ios_base::width
                ((ios_base *)
                 ((long)&(argument_local->m_names).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                 (argument_local->m_names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length),
                 name_padding.field_2._8_8_);
      poVar6 = std::operator<<((ostream *)argument_local,local_2c0);
      poVar6 = std::operator<<(poVar6,"  ");
      __str._M_str = (char *)line._M_len;
      __str._M_len = (size_t)pcVar5;
      leftover._M_str = pcVar5;
      std::operator<<(poVar6,__str);
    }
    sStack_2f8 = sVar4 + 1;
  }
  if (bVar2) {
    poVar6 = std::operator<<((ostream *)argument_local,"  ");
    std::operator<<(poVar6,(string *)&local_18->m_help);
  }
  else {
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&local_18->m_help);
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&line._M_str,sStack_2f8,
                       sVar4 - sStack_2f8);
    leftover._M_len = (size_t)bVar7._M_str;
    auStack_378 = (undefined1  [8])bVar7._M_len;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_378);
    if (!bVar2) {
      std::ios_base::width
                ((ios_base *)
                 ((long)&(argument_local->m_names).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                 (argument_local->m_names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length),
                 name_padding.field_2._8_8_);
      poVar6 = std::operator<<((ostream *)argument_local,local_2c0);
      poVar6 = std::operator<<(poVar6,"  ");
      local_388 = (size_t)auStack_378;
      sStack_380 = leftover._M_len;
      bVar7._M_str = (char *)leftover._M_len;
      bVar7._M_len = (size_t)auStack_378;
      std::operator<<(poVar6,bVar7);
    }
  }
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&local_18->m_help);
  if (!bVar2) {
    std::operator<<((ostream *)argument_local," ");
  }
  operator<<((ostream *)argument_local,&local_18->m_num_args_range);
  bVar2 = std::any::has_value(&local_18->m_default_value);
  local_451 = false;
  if (bVar2) {
    pNVar3 = &local_18->m_num_args_range;
    Argument::NArgsRange::NArgsRange(&local_398,0,0);
    local_451 = Argument::NArgsRange::operator!=(pNVar3,&local_398);
  }
  if (local_451 == false) {
    if (((byte)local_18->field_0x140 >> 2 & 1) != 0) {
      std::operator<<((ostream *)argument_local,"[required]");
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)argument_local,"[default: ");
    poVar6 = std::operator<<(poVar6,(string *)&local_18->m_default_value_repr);
    std::operator<<(poVar6,"]");
  }
  std::operator<<((ostream *)argument_local,"\n");
  pAVar1 = argument_local;
  std::__cxx11::string::~string(local_2c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return (ostream *)pAVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &stream,
                                  const Argument &argument) {
    std::stringstream name_stream;
    name_stream << "  "; // indent
    if (argument.is_positional(argument.m_names.front(),
                               argument.m_prefix_chars)) {
      if (!argument.m_metavar.empty()) {
        name_stream << argument.m_metavar;
      } else {
        name_stream << details::join(argument.m_names.begin(),
                                     argument.m_names.end(), " ");
      }
    } else {
      name_stream << details::join(argument.m_names.begin(),
                                   argument.m_names.end(), ", ");
      // If we have a metavar, and one narg - print the metavar
      if (!argument.m_metavar.empty() &&
          argument.m_num_args_range == NArgsRange{1, 1}) {
        name_stream << " " << argument.m_metavar;
      }
    }

    // align multiline help message
    auto stream_width = stream.width();
    auto name_padding = std::string(name_stream.str().size(), ' ');
    auto pos = std::string::size_type{};
    auto prev = std::string::size_type{};
    auto first_line = true;
    auto hspace = "  "; // minimal space between name and help message
    stream << name_stream.str();
    std::string_view help_view(argument.m_help);
    while ((pos = argument.m_help.find('\n', prev)) != std::string::npos) {
      auto line = help_view.substr(prev, pos - prev + 1);
      if (first_line) {
        stream << hspace << line;
        first_line = false;
      } else {
        stream.width(stream_width);
        stream << name_padding << hspace << line;
      }
      prev += pos - prev + 1;
    }
    if (first_line) {
      stream << hspace << argument.m_help;
    } else {
      auto leftover = help_view.substr(prev, argument.m_help.size() - prev);
      if (!leftover.empty()) {
        stream.width(stream_width);
        stream << name_padding << hspace << leftover;
      }
    }

    // print nargs spec
    if (!argument.m_help.empty()) {
      stream << " ";
    }
    stream << argument.m_num_args_range;

    if (argument.m_default_value.has_value() &&
        argument.m_num_args_range != NArgsRange{0, 0}) {
      stream << "[default: " << argument.m_default_value_repr << "]";
    } else if (argument.m_is_required) {
      stream << "[required]";
    }
    stream << "\n";
    return stream;
  }